

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O0

void sysbvm_byteStream_increaseCapacityToAtLeast
               (sysbvm_context_t *context,sysbvm_tuple_t byteStream,size_t requiredCapacity)

{
  sysbvm_size_t __n;
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_object_tuple_t *oldStorage;
  sysbvm_object_tuple_t *newStorage;
  size_t newCapacity;
  size_t oldCapacity;
  size_t size;
  sysbvm_byteStream_t *byteStreamObject;
  size_t requiredCapacity_local;
  sysbvm_tuple_t byteStream_local;
  sysbvm_context_t *context_local;
  
  __n = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(byteStream + 0x10));
  sVar1 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(byteStream + 0x18));
  newStorage = (sysbvm_object_tuple_t *)(sVar1 << 1);
  if (newStorage < (sysbvm_object_tuple_t *)0x10) {
    newStorage = (sysbvm_object_tuple_t *)0x10;
  }
  for (; newStorage < requiredCapacity;
      newStorage = (sysbvm_object_tuple_t *)((long)newStorage << 1)) {
  }
  sVar2 = sysbvm_byteArray_create(context,(sysbvm_tuple_t)newStorage);
  memcpy((void *)(sVar2 + 0x10),(void *)(*(long *)(byteStream + 0x18) + 0x10),__n);
  *(sysbvm_tuple_t *)(byteStream + 0x18) = sVar2;
  return;
}

Assistant:

static void sysbvm_byteStream_increaseCapacityToAtLeast(sysbvm_context_t *context, sysbvm_tuple_t byteStream, size_t requiredCapacity)
{
    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t oldCapacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 16)
        newCapacity = 16;
    while(newCapacity < requiredCapacity)
        newCapacity *= 2;

    sysbvm_object_tuple_t *newStorage = (sysbvm_object_tuple_t*)sysbvm_byteArray_create(context, newCapacity);
    sysbvm_object_tuple_t *oldStorage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(newStorage->bytes, oldStorage->bytes, size);
    byteStreamObject->storage = (sysbvm_tuple_t)newStorage;
}